

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::Properties::print(Properties *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Properties::print()
{
  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    std::cout << it->first << "=" << it->second << std::endl;
  }
}